

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O1

BOOL __thiscall
Js::JavascriptProxy::GetPropertyDescriptorTrap
          (JavascriptProxy *this,PropertyId propertyId,PropertyDescriptor *resultDescriptor,
          ScriptContext *requestContext)

{
  ImplicitCallFlags IVar1;
  ScriptContext *scriptContext;
  ThreadContext *this_00;
  Type *pTVar2;
  long *plVar3;
  code *pcVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  BOOL BVar9;
  Attributes attributes;
  BOOL BVar10;
  BOOL BVar11;
  Var pvVar12;
  RecyclableObject *obj;
  undefined4 *puVar13;
  JavascriptFunction *function;
  Var aValue;
  JavascriptMethod p_Var14;
  RecyclableObject *ptr;
  RecyclableObject *this_01;
  PropertyDescriptor *this_02;
  Type typeId;
  undefined1 local_88 [8];
  PropertyDescriptor targetDescriptor;
  
  scriptContext =
       (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  this_00 = requestContext->threadContext;
  if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_External;
    return 0;
  }
  targetDescriptor._40_8_ = resultDescriptor;
  pvVar12 = CrossSite::MarshalVar(requestContext,(this->handler).ptr,false);
  if (pvVar12 == (Var)0x0) {
    bVar6 = ThreadContext::RecordImplicitException(this_00);
    if (!bVar6) {
      return 0;
    }
    JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea15,L"getOwnPropertyDescriptor");
  }
  obj = (RecyclableObject *)CrossSite::MarshalVar(requestContext,(this->target).ptr,false);
  iVar8 = (**(code **)(**(long **)((this->super_DynamicObject).super_RecyclableObject.type.ptr + 1)
                      + 0x30))();
  if ((iVar8 != 0) &&
     (pTVar2 = (this->super_DynamicObject).super_RecyclableObject.type.ptr,
     plVar3 = *(long **)(pTVar2 + 1),
     iVar8 = (**(code **)(*plVar3 + 0x48))
                       (plVar3,(((pTVar2->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                               scriptContext.ptr,0), iVar8 != 7)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0xdc,
                                "((static_cast<DynamicType*>(GetType()))->GetTypeHandler()->GetPropertyCount() == 0 || (static_cast<DynamicType*>(GetType()))->GetTypeHandler()->GetPropertyId(GetScriptContext(), 0) == InternalPropertyIds::WeakMapKeyMap)"
                                ,
                                "(static_cast<DynamicType*>(GetType()))->GetTypeHandler()->GetPropertyCount() == 0 || (static_cast<DynamicType*>(GetType()))->GetTypeHandler()->GetPropertyId(GetScriptContext(), 0) == InternalPropertyIds::WeakMapKeyMap"
                               );
    if (!bVar6) goto LAB_00d06f77;
    *puVar13 = 0;
  }
  function = GetMethodHelper(this,0xa4,requestContext);
  if ((function == (JavascriptFunction *)0x0) ||
     (bVar6 = Memory::Recycler::IsHeapEnumInProgress
                        (((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                            javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)
                         ->recycler), bVar6)) {
    *(undefined1 *)(targetDescriptor._40_8_ + 0x29) = 0;
    BVar9 = JavascriptOperators::GetOwnPropertyDescriptor
                      (obj,propertyId,requestContext,(PropertyDescriptor *)targetDescriptor._40_8_);
    return BVar9;
  }
  aValue = GetName(requestContext,propertyId);
  bVar6 = VarIs<Js::JavascriptString>(aValue);
  if ((!bVar6) && (bVar6 = VarIs<Js::JavascriptSymbol>(aValue), !bVar6)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0xea,
                                "(VarIs<JavascriptString>(propertyName) || VarIs<JavascriptSymbol>(propertyName))"
                                ,
                                "VarIs<JavascriptString>(propertyName) || VarIs<JavascriptSymbol>(propertyName)"
                               );
    if (!bVar6) goto LAB_00d06f77;
    *puVar13 = 0;
  }
  bVar6 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
  bVar7 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)function,attributes);
  if (bVar7) {
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    if (this_00->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var14 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    CheckIsExecutable((RecyclableObject *)function,p_Var14);
    p_Var14 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    ptr = (RecyclableObject *)
          (*p_Var14)((RecyclableObject *)function,(CallInfo)function,0x2000003,0,0,0,0,0x2000003,
                     pvVar12,obj,aValue);
    bVar7 = ThreadContext::IsOnStack(ptr);
LAB_00d06b27:
    if (bVar7 != false) {
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
    }
  }
  else if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
    if ((attributes & HasNoSideEffect) != None) {
      ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
      if (this_00->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var14 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      CheckIsExecutable((RecyclableObject *)function,p_Var14);
      p_Var14 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      ptr = (RecyclableObject *)
            (*p_Var14)((RecyclableObject *)function,(CallInfo)function,0x2000003,0,0,0,0,0x2000003,
                       pvVar12,obj,aValue);
      bVar7 = ThreadContext::IsOnStack(ptr);
      goto LAB_00d06b27;
    }
    IVar1 = this_00->implicitCallFlags;
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    if (this_00->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var14 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    CheckIsExecutable((RecyclableObject *)function,p_Var14);
    p_Var14 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    ptr = (RecyclableObject *)
          (*p_Var14)((RecyclableObject *)function,(CallInfo)function,0x2000003,0,0,0,0,0x2000003,
                     pvVar12,obj,aValue);
    this_00->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
  }
  else {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
    ptr = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
            super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue
          .ptr;
  }
  this_00->reentrancySafeOrHandled = bVar6;
  if (ptr == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar6) goto LAB_00d06f77;
    *puVar13 = 0;
  }
  if (((ulong)ptr & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)ptr & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar6) goto LAB_00d06f77;
    *puVar13 = 0;
  }
  typeId = TypeIds_FirstNumberType;
  if ((((ulong)ptr & 0xffff000000000000) != 0x1000000000000) &&
     (typeId = TypeIds_Number, (ulong)ptr >> 0x32 == 0)) {
    this_01 = UnsafeVarTo<Js::RecyclableObject>(ptr);
    if (this_01 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar6) goto LAB_00d06f77;
      *puVar13 = 0;
    }
    typeId = ((this_01->type).ptr)->typeId;
    if ((0x57 < (int)typeId) && (BVar9 = RecyclableObject::IsExternal(this_01), BVar9 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar6) {
LAB_00d06f77:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar13 = 0;
    }
  }
  bVar6 = StaticType::Is(typeId);
  if (typeId != TypeIds_Undefined && bVar6) {
    JavascriptError::ThrowTypeError(requestContext,-0x7ff5ec71,L"getOwnPropertyDescriptor");
  }
  this_02 = (PropertyDescriptor *)local_88;
  PropertyDescriptor::PropertyDescriptor(this_02);
  BVar9 = JavascriptOperators::GetOwnPropertyDescriptor(obj,propertyId,requestContext,this_02);
  uVar5 = targetDescriptor._40_8_;
  if (typeId == TypeIds_Undefined) {
    if ((BVar9 == 0) ||
       ((bVar6 = PropertyDescriptor::IsConfigurable((PropertyDescriptor *)local_88), bVar6 &&
        (iVar8 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject[0x33])(), iVar8 != 0)))) {
      return 0;
    }
  }
  else {
    iVar8 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x33])(obj);
    BVar10 = JavascriptOperators::ToPropertyDescriptor
                       (ptr,(PropertyDescriptor *)uVar5,requestContext);
    uVar5 = targetDescriptor._40_8_;
    if ((iVar8 == 0) || (BVar10 != 0)) {
      JavascriptOperators::CompletePropertyDescriptor
                ((PropertyDescriptor *)targetDescriptor._40_8_,(PropertyDescriptor *)0x0,
                 requestContext);
      if (BVar9 == 0) {
        this_02 = (PropertyDescriptor *)0x0;
      }
      BVar11 = JavascriptOperators::IsCompatiblePropertyDescriptor
                         ((PropertyDescriptor *)uVar5,this_02,iVar8 != 0,true,requestContext);
      if ((BVar11 != 0) &&
         ((bVar6 = PropertyDescriptor::IsConfigurable((PropertyDescriptor *)uVar5), bVar6 ||
          ((BVar9 != 0 &&
           (bVar6 = PropertyDescriptor::IsConfigurable((PropertyDescriptor *)local_88), !bVar6))))))
      {
        *(undefined1 *)(uVar5 + 0x29) = 1;
        return BVar10;
      }
    }
  }
  JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea14,L"getOwnPropertyDescriptor");
}

Assistant:

BOOL JavascriptProxy::GetPropertyDescriptorTrap(PropertyId propertyId, PropertyDescriptor* resultDescriptor, ScriptContext* requestContext)
    {
        PROBE_STACK(GetScriptContext(), Js::Constants::MinStackDefault);

        // Reject implicit call
        ThreadContext* threadContext = requestContext->GetThreadContext();
        if (threadContext->IsDisableImplicitCall())
        {
            threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);
            return FALSE;
        }

        //1. Let handler be the value of the[[ProxyHandler]] internal slot of O.
        Js::RecyclableObject *handlerObj = this->MarshalHandler(requestContext);

        //2. If handler is null, then throw a TypeError exception.
        if (handlerObj == nullptr)
        {
            if (!threadContext->RecordImplicitException())
                return FALSE;
            JavascriptError::ThrowTypeError(requestContext, JSERR_ErrorOnRevokedProxy, _u("getOwnPropertyDescriptor"));
        }
        //3. Let target be the value of the[[ProxyTarget]] internal slot of O.
        Js::RecyclableObject *targetObj = this->MarshalTarget(requestContext);

        Assert((static_cast<DynamicType*>(GetType()))->GetTypeHandler()->GetPropertyCount() == 0 ||
            (static_cast<DynamicType*>(GetType()))->GetTypeHandler()->GetPropertyId(GetScriptContext(), 0) == InternalPropertyIds::WeakMapKeyMap);

        JavascriptFunction* gOPDMethod = GetMethodHelper(PropertyIds::getOwnPropertyDescriptor, requestContext);

        //7. If trap is undefined, then
        //    a.Return the result of calling the[[GetOwnProperty]] internal method of target with argument P.
        if (nullptr == gOPDMethod || GetScriptContext()->IsHeapEnumInProgress())
        {
            resultDescriptor->SetFromProxy(false);
            return JavascriptOperators::GetOwnPropertyDescriptor(targetObj, propertyId, requestContext, resultDescriptor);
        }

        Var propertyName = GetName(requestContext, propertyId);

        Assert(VarIs<JavascriptString>(propertyName) || VarIs<JavascriptSymbol>(propertyName));
        //8. Let trapResultObj be the result of calling the[[Call]] internal method of trap with handler as the this value and a new List containing target and P.
        //9. ReturnIfAbrupt(trapResultObj).
        //10. If Type(trapResultObj) is neither Object nor Undefined, then throw a TypeError exception.

        Var getResult = threadContext->ExecuteImplicitCall(gOPDMethod, ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, gOPDMethod, CallInfo(CallFlags_Value, 3), handlerObj, targetObj, propertyName);
        });

        TypeId getResultTypeId = JavascriptOperators::GetTypeId(getResult);
        if (StaticType::Is(getResultTypeId) && getResultTypeId != TypeIds_Undefined)
        {
            JavascriptError::ThrowTypeError(requestContext, JSERR_NeedObject, _u("getOwnPropertyDescriptor"));
        }
        //11. Let targetDesc be the result of calling the[[GetOwnProperty]] internal method of target with argument P.
        //12. ReturnIfAbrupt(targetDesc).
        PropertyDescriptor targetDescriptor;
        BOOL hasProperty = JavascriptOperators::GetOwnPropertyDescriptor(targetObj, propertyId, requestContext, &targetDescriptor);

        //13. If trapResultObj is undefined, then
        //a.If targetDesc is undefined, then return undefined.
        //b.If targetDesc.[[Configurable]] is false, then throw a TypeError exception.
        //c.Let extensibleTarget be the result of IsExtensible(target).
        //d.ReturnIfAbrupt(extensibleTarget).
        //e.If ToBoolean(extensibleTarget) is false, then throw a TypeError exception.
        //f.Return undefined.
        if (getResultTypeId == TypeIds_Undefined)
        {
            if (!hasProperty)
            {
                return FALSE;
            }
            if (!targetDescriptor.IsConfigurable())
            {
                JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("getOwnPropertyDescriptor"));
            }

            // do not use "target" here, the trap may have caused it to change
            if (!targetObj->IsExtensible())
            {
                JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("getOwnPropertyDescriptor"));
            }

            return FALSE;
        }

        //14. Let extensibleTarget be the result of IsExtensible(target).
        //15. ReturnIfAbrupt(extensibleTarget).
        //16. Let resultDesc be ToPropertyDescriptor(trapResultObj).
        //17. ReturnIfAbrupt(resultDesc).
        //18. Call CompletePropertyDescriptor(resultDesc, targetDesc).
        //19. Let valid be the result of IsCompatiblePropertyDescriptor(extensibleTarget, resultDesc, targetDesc).
        //20. If valid is false, then throw a TypeError exception.
        //21. If resultDesc.[[Configurable]] is false, then
        //a.If targetDesc is undefined or targetDesc.[[Configurable]] is true, then
        //i.Throw a TypeError exception.
        //22. Return resultDesc.

        // do not use "target" here, the trap may have caused it to change
        BOOL isTargetExtensible = targetObj->IsExtensible();
        BOOL toProperty = JavascriptOperators::ToPropertyDescriptor(getResult, resultDescriptor, requestContext);
        if (!toProperty && isTargetExtensible)
        {
            JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("getOwnPropertyDescriptor"));
        }

        JavascriptOperators::CompletePropertyDescriptor(resultDescriptor, nullptr, requestContext);
        if (!JavascriptOperators::IsCompatiblePropertyDescriptor(*resultDescriptor, hasProperty ? &targetDescriptor : nullptr, !!isTargetExtensible, true, requestContext))
        {
            JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("getOwnPropertyDescriptor"));
        }
        if (!resultDescriptor->IsConfigurable())
        {
            if (!hasProperty || targetDescriptor.IsConfigurable())
            {
                JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("getOwnPropertyDescriptor"));
            }
        }
        resultDescriptor->SetFromProxy(true);
        return toProperty;
    }